

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O0

void __thiscall
google::
sparse_hashtable<int,int,Hasher,google::sparse_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>::Identity,google::sparse_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>::SetKey,Hasher,Alloc<int,unsigned_char,(unsigned_char)255>>
::insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (void *param_1,int *param_2)

{
  byte bVar1;
  length_error *this;
  size_type unaff_retaddr;
  sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>
  *in_stack_00000008;
  const_reference in_stack_00000088;
  size_t dist;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff60;
  ulong uVar2;
  ulong local_28;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_8;
  
  local_8._M_current = param_2;
  local_28 = std::distance<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       (in_stack_ffffffffffffff60,
                        (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)param_1);
  uVar2 = local_28;
  bVar1 = std::numeric_limits<unsigned_char>::max();
  if (bVar1 <= uVar2) {
    this = (length_error *)__cxa_allocate_exception(0x10);
    std::length_error::length_error(this,"insert-range overflow");
    __cxa_throw(this,&std::length_error::typeinfo,std::length_error::~length_error);
  }
  sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>
  ::resize_delta(in_stack_00000008,unaff_retaddr);
  while (local_28 != 0) {
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
              (&local_8);
    sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>
    ::insert_noresize((sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>
                       *)dist,in_stack_00000088);
    local_28 = local_28 - 1;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_8);
  }
  return;
}

Assistant:

void insert(ForwardIterator f, ForwardIterator l, std::forward_iterator_tag) {
    size_t dist = std::distance(f, l);
    if (dist >= (std::numeric_limits<size_type>::max)()) {
      throw std::length_error("insert-range overflow");
    }
    resize_delta(static_cast<size_type>(dist));
    for (; dist > 0; --dist, ++f) {
      insert_noresize(*f);
    }
  }